

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

size_t __thiscall
Potassco::ProgramOptions::DefaultFormat::format
          (DefaultFormat *this,vector<char,_std::allocator<char>_> *buffer,OptionGroup *grp)

{
  size_type sVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pcVar2;
  pointer pcVar3;
  char local_1c [4];
  
  pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar2) {
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  sVar1 = (grp->caption_)._M_string_length;
  pcVar3 = pcVar2;
  if (sVar1 != 0) {
    std::vector<char,_std::allocator<char>_>::reserve(buffer,sVar1 + 4);
    local_1c[3] = 10;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c + 3);
    __first._M_current = (grp->caption_)._M_dataplus._M_p;
    std::vector<char,std::allocator<char>>::
    insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<char,std::allocator<char>> *)buffer,
               (const_iterator)
               (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish,__first,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(__first._M_current + (grp->caption_)._M_string_length));
    local_1c[2] = 0x3a;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c + 2);
    local_1c[1] = 10;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c + 1);
    local_1c[0] = '\n';
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c);
    pcVar3 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  return (long)pcVar2 - (long)pcVar3;
}

Assistant:

std::size_t DefaultFormat::format(std::vector<char>& buffer, const OptionGroup& grp) {
	buffer.clear();
	if (grp.caption().length()) {
		buffer.reserve(grp.caption().length() + 4);
		buffer.push_back('\n');
		buffer.insert(buffer.end(), grp.caption().begin(), grp.caption().end());
		buffer.push_back(':');
		buffer.push_back('\n');
		buffer.push_back('\n');
	}
	return buffer.size();
}